

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O0

void PMurHash32_Process(uint32_t *ph1,uint32_t *pcarry,void *key,int len)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  int _i_1;
  uint32_t k1_3;
  uint32_t k1_2;
  uint32_t k1_1;
  uint32_t k1;
  int _i;
  int i;
  int n;
  uchar *end;
  uchar *ptr;
  uint32_t c;
  uint32_t h1;
  int len_local;
  void *key_local;
  uint32_t *pcarry_local;
  uint32_t *ph1_local;
  
  h1 = *ph1;
  c = *pcarry;
  n = c & 3;
  _i = -(int)key & 3;
  ptr = (uchar *)key;
  len_local = len;
  if ((_i != 0) && (_i <= len)) {
    while (iVar2 = _i + -1, _i != 0) {
      uVar1 = c >> 8;
      puVar3 = ptr + 1;
      c = uVar1 | (uint)*ptr << 0x18;
      n = n + 1;
      len_local = len_local + -1;
      _i = iVar2;
      ptr = puVar3;
      if (n == 4) {
        c = (uVar1 * 0x16a88000 | c * -0x3361d2af >> 0x11) * 0x1b873593;
        h1 = ((c ^ h1) << 0xd | (c ^ h1) >> 0x13) * 5 + 0xe6546b64;
        n = 0;
      }
    }
  }
  uVar1 = len_local;
  if (len_local < 0) {
    uVar1 = len_local + 3;
  }
  puVar3 = ptr + (int)(uVar1 & 0xfffffffc);
  switch(n) {
  case 0:
    for (; ptr < puVar3; ptr = ptr + 4) {
      uVar1 = (*(int *)ptr * 0x16a88000 | (uint)(*(int *)ptr * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              h1;
      h1 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 1:
    for (; ptr < puVar3; ptr = ptr + 4) {
      uVar1 = c >> 0x18;
      c = *(uint32_t *)ptr;
      uVar1 = c << 8 | uVar1;
      uVar1 = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ h1;
      h1 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 2:
    for (; ptr < puVar3; ptr = ptr + 4) {
      uVar1 = c >> 0x10;
      c = *(uint32_t *)ptr;
      uVar1 = c << 0x10 | uVar1;
      uVar1 = (uVar1 * 0x16a88000 | uVar1 * -0x3361d2af >> 0x11) * 0x1b873593 ^ h1;
      h1 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
    break;
  case 3:
    for (; ptr < puVar3; ptr = ptr + 4) {
      uVar1 = c >> 8;
      c = *(uint32_t *)ptr;
      uVar1 = (uVar1 * 0x16a88000 | (c << 0x18 | uVar1) * -0x3361d2af >> 0x11) * 0x1b873593 ^ h1;
      h1 = (uVar1 << 0xd | uVar1 >> 0x13) * 5 + 0xe6546b64;
    }
  }
  _i_1 = len_local % 4;
  while (iVar2 = _i_1 + -1, _i_1 != 0) {
    uVar1 = c >> 8;
    puVar3 = ptr + 1;
    c = uVar1 | (uint)*ptr << 0x18;
    n = n + 1;
    _i_1 = iVar2;
    ptr = puVar3;
    if (n == 4) {
      c = (uVar1 * 0x16a88000 | c * -0x3361d2af >> 0x11) * 0x1b873593;
      h1 = ((c ^ h1) << 0xd | (c ^ h1) >> 0x13) * 5 + 0xe6546b64;
      n = 0;
    }
  }
  *ph1 = h1;
  *pcarry = c & 0xffffff00 | n;
  return;
}

Assistant:

void PMurHash32_Process(uint32_t *ph1, uint32_t *pcarry, const void *key, int len)
{
  uint32_t h1 = *ph1;
  uint32_t c = *pcarry;

  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end;

  /* Extract carry count from low 2 bits of c value */
  int n = c & 3;

#if defined(UNALIGNED_SAFE)
  /* This CPU handles unaligned word access */

  /* Consume any carry bytes */
  int i = (4-n) & 3;
  if(i && i <= len) {
    DOBYTES(i, h1, c, n, ptr, len);
  }

  /* Process 32-bit chunks */
  end = ptr + len/4*4;
  for( ; ptr < end ; ptr+=4) {
    uint32_t k1 = READ_UINT32(ptr);
    DOBLOCK(h1, k1);
  }

#else /*UNALIGNED_SAFE*/
  /* This CPU does not handle unaligned word access */

  /* Consume enough so that the next data byte is word aligned */
  int i = -(intptr_t)ptr & 3;
  if(i && i <= len) {
      DOBYTES(i, h1, c, n, ptr, len);
  }

  /* We're now aligned. Process in aligned blocks. Specialise for each possible carry count */
  end = ptr + len/4*4;
  switch(n) { /* how many bytes in c */
  case 0: /* c=[----]  w=[3210]  b=[3210]=w            c'=[----] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = READ_UINT32(ptr);
      DOBLOCK(h1, k1);
    }
    break;
  case 1: /* c=[0---]  w=[4321]  b=[3210]=c>>24|w<<8   c'=[4---] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>24;
      c = READ_UINT32(ptr);
      k1 |= c<<8;
      DOBLOCK(h1, k1);
    }
    break;
  case 2: /* c=[10--]  w=[5432]  b=[3210]=c>>16|w<<16  c'=[54--] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>16;
      c = READ_UINT32(ptr);
      k1 |= c<<16;
      DOBLOCK(h1, k1);
    }
    break;
  case 3: /* c=[210-]  w=[6543]  b=[3210]=c>>8|w<<24   c'=[654-] */
    for( ; ptr < end ; ptr+=4) {
      uint32_t k1 = c>>8;
      c = READ_UINT32(ptr);
      k1 |= c<<24;
      DOBLOCK(h1, k1);
    }
  }
#endif /*UNALIGNED_SAFE*/

  /* Advance over whole 32-bit chunks, possibly leaving 1..3 bytes */
  len -= len/4*4;

  /* Append any remaining bytes into carry */
  DOBYTES(len, h1, c, n, ptr, len);

  /* Copy out new running hash and carry */
  *ph1 = h1;
  *pcarry = (c & ~0xff) | n;
}